

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

int __thiscall HttpServer::GET(HttpServer *this,char *url_pattern,handler_t *callback)

{
  code *pcVar1;
  function<void_(HttpRequest_&)> local_78;
  allocator local_41;
  string local_40;
  handler_t *local_20;
  handler_t *callback_local;
  char *url_pattern_local;
  HttpServer *this_local;
  
  local_20 = callback;
  callback_local = (handler_t *)url_pattern;
  url_pattern_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,url_pattern,&local_41);
  std::function<void_(HttpRequest_&)>::function(&local_78,callback);
  httprouter::node::addRoute(&this->no,&local_40,&local_78);
  std::function<void_(HttpRequest_&)>::~function(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int GET(char *url_pattern, handler_t callback)
    {
        no.addRoute(url_pattern, callback);
    }